

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void prvTidyPPrintTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  int iVar1;
  Dict *pDVar2;
  ulong uVar3;
  ulong uVar4;
  Lexer *node_00;
  bool bVar5;
  Bool BVar6;
  Bool BVar7;
  int iVar8;
  Dict *pDVar9;
  AttVal *pAVar10;
  ctmbstr ptVar11;
  Node *pNVar12;
  Node **ppNVar13;
  TidyTagId TVar14;
  uint *node_01;
  Lexer *pLVar15;
  Node *pNVar16;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 uVar17;
  Node **ppNVar18;
  uint mode_00;
  uint uVar19;
  bool bVar20;
  Lexer *local_60;
  int local_58;
  int local_48;
  char *local_40;
  
  if (node == (Node *)0x0) {
    return;
  }
  BVar7 = *(Bool *)((doc->config).value + 0x26);
  iVar1 = *(int *)((doc->config).value + 0x62);
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
  }
  node_01 = &switchD_00145052::switchdataD_00188ca0;
  switch(node->type) {
  case RootNode:
    ppNVar18 = &node->content;
    while (pNVar12 = *ppNVar18, pNVar12 != (Node *)0x0) {
      prvTidyPPrintTree(doc,mode,indent,pNVar12);
      ppNVar18 = &pNVar12->next;
    }
    return;
  case DocTypeTag:
    PPrintDocType(doc,indent,node);
    return;
  case CommentTag:
    PPrintComment(doc,indent,node);
    return;
  case ProcInsTag:
    PPrintPI(doc,indent,node);
    return;
  case TextNode:
    PPrintText(doc,mode,indent,node);
    return;
  case CDATATag:
    PPrintCDATA(doc,indent,node);
    return;
  case SectionTag:
    PPrintSection(doc,indent,node);
    return;
  case AspTag:
    PPrintAsp(doc,indent,node);
    return;
  case JsteTag:
    PPrintJste(doc,indent,node);
    return;
  case PhpTag:
    PPrintPhp(doc,indent,node);
    return;
  case XmlDecl:
    PPrintXmlDecl(doc,indent,node);
    return;
  }
  mode_00 = (uint)node;
  pNVar12 = node;
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MATHML)) {
    PPrintTag(doc,4,indent,node);
    ppNVar18 = &node->content;
    uVar17 = extraout_RDX;
    while( true ) {
      uVar19 = (uint)uVar17;
      pNVar16 = *ppNVar18;
      if (pNVar16 == (Node *)0x0) break;
      pNVar12 = pNVar16;
      prvTidyPPrintTree(doc,4,indent,pNVar16);
      ppNVar18 = &pNVar16->next;
      uVar17 = extraout_RDX_00;
    }
    goto LAB_001455b6;
  }
  BVar6 = prvTidynodeCMIsEmpty(node);
  if ((BVar6 != no) || ((node->type == StartEndTag && (iVar1 == 0)))) {
    BVar7 = prvTidynodeHasCM(node,0x10);
    if (BVar7 == no) {
      PCondFlushLineSmart(doc,indent);
    }
    pDVar9 = node->tag;
    if (pDVar9 != (Dict *)0x0) {
      TVar14 = pDVar9->id;
      if (TVar14 == TidyTag_BR) {
        if (node->prev != (Node *)0x0) {
          pDVar2 = node->prev->tag;
          if (pDVar2 == (Dict *)0x0) {
            if ((mode & 1) == 0) goto LAB_0014537a;
          }
          else if (((mode & 1) == 0) && (pDVar2->id != TidyTag_BR)) {
LAB_0014537a:
            if (*(int *)((doc->config).value + 7) != 0) {
              PFlushLineSmart(doc,indent);
              pDVar9 = node->tag;
              if (pDVar9 == (Dict *)0x0) goto LAB_001453c0;
            }
          }
        }
        TVar14 = pDVar9->id;
      }
      if ((((TVar14 == TidyTag_HR) && (*(int *)((doc->config).value + 0x57) == 1)) &&
          (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
        PFlushLineSmart(doc,indent);
      }
    }
LAB_001453c0:
    PPrintTag(doc,mode,indent,node);
    if (node->next == (Node *)0x0) {
      return;
    }
    if (node->tag == (Dict *)0x0) {
      return;
    }
    TVar14 = node->tag->id;
    if ((TVar14 == TidyTag_PARAM) || (TVar14 == TidyTag_AREA)) {
      PCondFlushLineSmart(doc,indent);
      return;
    }
    if ((((byte)mode | TVar14 != TidyTag_BR) & TVar14 != TidyTag_HR) != 0) {
      return;
    }
    goto LAB_00145423;
  }
  if (node->type == StartEndTag) {
    node->type = StartTag;
  }
  pDVar9 = node->tag;
  if (pDVar9 != (Dict *)0x0) {
    if (pDVar9->parser != prvTidyParsePre) {
      TVar14 = pDVar9->id;
      if ((TVar14 == TidyTag_SCRIPT) || (TVar14 == TidyTag_STYLE)) {
        pprint = &doc->pprint;
        iVar1 = *(int *)((doc->config).value + 0x62);
        do {
          if ((pNVar12->tag != (Dict *)0x0) && (pNVar12->tag->id == TidyTag_HEAD)) {
            PFlushLineSmart(doc,indent);
            break;
          }
          pNVar12 = pNVar12->parent;
        } while (pNVar12 != (Node *)0x0);
        PCondFlushLineSmart(doc,indent);
        PPrintTag(doc,mode | 0x19,indent,node);
        uVar17 = extraout_RDX_05;
        if (node->content != (Node *)0x0) {
          PFlushLineSmart(doc,indent);
          uVar17 = extraout_RDX_06;
        }
        ppNVar18 = &node->content;
        pLVar15 = (Lexer *)0x1886e8;
        if (iVar1 == 0) {
          bVar5 = false;
          local_40 = "";
          local_60 = (Lexer *)0x1886e8;
        }
        else if (*ppNVar18 == (Node *)0x0) {
          bVar5 = false;
          local_40 = "";
          local_60 = (Lexer *)0x1886e8;
        }
        else {
          pAVar10 = prvTidyAttrGetById(node,TidyAttr_TYPE);
          if ((pAVar10 == (AttVal *)0x0) || (pAVar10->value == (ctmbstr)0x0)) {
LAB_00145723:
            local_40 = "";
            local_60 = (Lexer *)0x1886e8;
          }
          else {
            iVar8 = prvTidytmbstrcasecmp(pAVar10->value,"text/javascript");
            if (iVar8 == 0) {
              local_60 = (Lexer *)0x189dfc;
              local_40 = "";
            }
            else {
              if (pAVar10->value == (ctmbstr)0x0) goto LAB_00145723;
              iVar8 = prvTidytmbstrcasecmp(pAVar10->value,"text/css");
              if (iVar8 == 0) {
                local_60 = (Lexer *)0x189dff;
                local_40 = "*/";
              }
              else {
                local_40 = "";
                local_60 = (Lexer *)0x1886e8;
                if (pAVar10->value != (ctmbstr)0x0) {
                  iVar8 = prvTidytmbstrcasecmp(pAVar10->value,"text/vbscript");
                  pLVar15 = (Lexer *)0x1b3134;
                  local_40 = "";
                  local_60 = pLVar15;
                  if (iVar8 != 0) {
                    pLVar15 = (Lexer *)0x1886e8;
                    local_60 = pLVar15;
                  }
                }
              }
            }
          }
          pNVar12 = *ppNVar18;
          if (pNVar12->type == TextNode) {
            pLVar15 = doc->lexer;
            ptVar11 = prvTidytmbsubstrn(pLVar15->lexbuf + pNVar12->start,
                                        (pNVar12->end - pNVar12->start) + 1,"<![CDATA[");
            if (ptVar11 != (ctmbstr)0x0) {
              bVar5 = true;
              uVar17 = extraout_RDX_07;
              goto LAB_001457e2;
            }
          }
          uVar19 = WrapOff(doc);
          AddString(pprint,(ctmbstr)local_60);
          AddString(pprint,"<![CDATA[");
          AddString(pprint,local_40);
          PCondFlushLineSmart(doc,indent);
          WrapOn(doc,uVar19);
          bVar5 = false;
          uVar17 = extraout_RDX_08;
        }
LAB_001457e2:
        iVar8 = -1;
        ppNVar13 = ppNVar18;
        while (node_00 = (Lexer *)*ppNVar13, node_00 != (Lexer *)0x0) {
          pLVar15 = node_00;
          prvTidyPPrintTree(doc,mode | 0x19,indent,(Node *)node_00);
          uVar17 = extraout_RDX_09;
          if (node_00 == (Lexer *)node->last) {
            iVar8 = TextEndsWithNewline(doc->lexer,(Node *)node_00,0x10);
            uVar17 = extraout_RDX_10;
          }
          ppNVar13 = (Node **)&node_00->insertspace;
        }
        pNVar12 = *ppNVar18;
        if (iVar8 < 0) {
          if (pNVar12 == (Node *)0x0) {
            pNVar12 = (Node *)0x0;
          }
          else {
            PCondFlushLineSmart(doc,indent);
            pNVar12 = *ppNVar18;
            uVar17 = extraout_RDX_11;
          }
        }
        bVar20 = pNVar12 == (Node *)0x0;
        uVar19 = (uint)CONCAT71((int7)((ulong)uVar17 >> 8),bVar20);
        pNVar16 = (Node *)CONCAT71((int7)((ulong)pLVar15 >> 8),iVar1 == 0 | bVar5 | bVar20);
        if ((iVar1 != 0 && !bVar5) && !bVar20) {
          uVar19 = WrapOff(doc);
          AddString(pprint,(ctmbstr)local_60);
          AddString(pprint,"]]>");
          AddString(pprint,local_40);
          WrapOn(doc,uVar19);
          PCondFlushLineSmart(doc,indent);
          pNVar12 = *ppNVar18;
          uVar19 = extraout_EDX_00;
        }
        if ((pNVar12 != (Node *)0x0) && ((doc->pprint).indent[0].spaces != indent)) {
          (doc->pprint).indent[0].spaces = indent;
        }
        PPrintEndTag(doc,mode_00,uVar19,pNVar16);
        if (*(int *)((doc->config).value + 0x25) != 0) {
          return;
        }
        if (node->next == (Node *)0x0) {
          return;
        }
        BVar7 = prvTidynodeHasCM(node,0x10);
        if (BVar7 != no) {
          return;
        }
        BVar7 = prvTidynodeIsText(node);
        if (BVar7 != no) {
          return;
        }
        goto LAB_00145423;
      }
      node_01 = (uint *)prvTidyParsePre;
      if (TVar14 != TidyTag_TEXTAREA) goto LAB_001452f2;
    }
    iVar1 = *(int *)((doc->config).value + 0x57);
    PCondFlushLineSmart(doc,indent);
    if (((iVar1 == 1) && (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
      PFlushLineSmart(doc,indent);
    }
    PPrintTag(doc,mode | 8,indent,node);
    ppNVar18 = &node->content;
    uVar17 = extraout_RDX_01;
    while (pNVar16 = *ppNVar18, pNVar16 != (Node *)0x0) {
      pNVar12 = pNVar16;
      prvTidyPPrintTree(doc,mode | 9,0,pNVar16);
      uVar17 = extraout_RDX_02;
      ppNVar18 = &pNVar16->next;
    }
    PPrintEndTag(doc,mode_00,(uint)uVar17,pNVar12);
    if (*(int *)((doc->config).value + 0x25) != 0) {
      return;
    }
    if (node->next == (Node *)0x0) {
      return;
    }
    goto LAB_00145423;
  }
LAB_001452f2:
  BVar6 = prvTidynodeCMIsInline(node);
  if (BVar6 != no) {
    if (((*(int *)((doc->config).value + 0x30) != 0) && (node->tag != (Dict *)0x0)) &&
       (node->tag->id == TidyTag_NOBR)) {
      ppNVar18 = &node->content;
      while (pNVar12 = *ppNVar18, pNVar12 != (Node *)0x0) {
        prvTidyPPrintTree(doc,mode | 8,indent,pNVar12);
        ppNVar18 = &pNVar12->next;
      }
      return;
    }
    PPrintTag(doc,mode,indent,node);
    BVar6 = ShouldIndent(doc,node);
    if (BVar6 == no) {
      ppNVar18 = &node->content;
      uVar17 = extraout_RDX_03;
      while( true ) {
        uVar19 = (uint)uVar17;
        pNVar16 = *ppNVar18;
        if (pNVar16 == (Node *)0x0) break;
        pNVar12 = pNVar16;
        prvTidyPPrintTree(doc,mode,indent,pNVar16);
        ppNVar18 = &pNVar16->next;
        uVar17 = extraout_RDX_04;
      }
    }
    else {
      PCondFlushLineSmart(doc,BVar7 + indent);
      ppNVar18 = &node->content;
      while (pNVar16 = *ppNVar18, pNVar16 != (Node *)0x0) {
        pNVar12 = pNVar16;
        prvTidyPPrintTree(doc,mode,BVar7 + indent,pNVar16);
        ppNVar18 = &pNVar16->next;
      }
      PCondFlushLineSmart(doc,indent);
      uVar19 = extraout_EDX;
    }
LAB_001455b6:
    PPrintEndTag(doc,mode_00,uVar19,pNVar12);
    return;
  }
  uVar3 = (doc->config).value[0x25].v;
  uVar4 = (doc->config).value[0x3b].v;
  iVar1 = *(int *)((doc->config).value + 0x57);
  if (((iVar1 == 1) && (node->parent != (Node *)0x0)) &&
     ((node->parent->content != node &&
      ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_HTML)))))) {
    PFlushLineSmart(doc,indent);
  }
  BVar6 = ShouldIndent(doc,node);
  if (BVar6 != no) {
    BVar6 = BVar7;
  }
  uVar19 = BVar6 + indent;
  PCondFlushLineSmart(doc,indent);
  local_48 = (int)uVar4;
  if (((local_48 == 0) || (BVar6 = prvTidynodeHasCM(node,0x200000), BVar6 == no)) ||
     (node->attributes != (AttVal *)0x0)) {
    node_01 = (uint *)node;
    PPrintTag(doc,mode,indent,node);
    BVar7 = ShouldIndent(doc,node);
    if (BVar7 == no) {
      BVar7 = prvTidynodeHasCM(node,2);
      if (((BVar7 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_NOFRAMES)))) ||
         ((BVar7 = prvTidynodeHasCM(node,4), BVar7 != no &&
          ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TITLE)))))) {
        PFlushLineSmart(doc,uVar19);
      }
    }
    else if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LI)) ||
            (BVar7 = prvTidynodeIsText(node->content), BVar7 == no)) {
      PCondFlushLineSmart(doc,uVar19);
    }
  }
  else {
    BVar6 = ShouldIndent(doc,node);
    if (BVar6 == no) {
      BVar7 = no;
    }
    uVar19 = uVar19 - BVar7;
  }
  ppNVar18 = &node->content;
  ppNVar13 = ppNVar18;
  pNVar12 = (Node *)0x0;
  while( true ) {
    pNVar16 = *ppNVar13;
    local_58 = (int)uVar3;
    if (pNVar16 == (Node *)0x0) break;
    if ((((pNVar12 != (Node *)0x0 && local_58 == 0) &&
         (BVar7 = prvTidynodeIsText(pNVar12), BVar7 != no)) && (pNVar16->tag != (Dict *)0x0)) &&
       (BVar7 = prvTidynodeHasCM(pNVar16,0x10), BVar7 == no)) {
      PFlushLineSmart(doc,uVar19);
    }
    node_01 = (uint *)pNVar16;
    prvTidyPPrintTree(doc,mode,uVar19,pNVar16);
    ppNVar13 = &pNVar16->next;
    pNVar12 = pNVar16;
  }
  BVar7 = ShouldIndent(doc,node);
  if (BVar7 == no) {
    if (local_48 == 0) {
      BVar7 = prvTidynodeHasCM(node,2);
      if (((BVar7 == no) && ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_NOFRAMES)))) &&
         ((BVar7 = prvTidynodeHasCM(node,4), uVar19 = extraout_EDX_04, BVar7 == no ||
          ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TITLE)))))) goto LAB_00145a4b;
      goto LAB_001459ad;
    }
    BVar7 = prvTidynodeHasCM(node,0x8000);
    uVar19 = extraout_EDX_03;
    if (BVar7 == no) {
LAB_00145a4b:
      if (iVar1 == 1) {
        do {
          pNVar12 = *ppNVar18;
          if (pNVar12 == (Node *)0x0) {
            PFlushLineSmart(doc,indent);
            uVar19 = extraout_EDX_06;
            break;
          }
          BVar7 = prvTidynodeIsText(pNVar12);
          ppNVar18 = &pNVar12->next;
          uVar19 = extraout_EDX_05;
        } while (BVar7 == no);
      }
      goto LAB_00145ad3;
    }
    if ((doc->pprint).indent[0].spaces != indent) {
      (doc->pprint).indent[0].spaces = indent;
    }
  }
  else {
LAB_001459ad:
    PCondFlushLineSmart(doc,indent);
    uVar19 = extraout_EDX_01;
    if ((local_48 == 0) ||
       (BVar7 = prvTidynodeHasCM(node,0x8000), uVar19 = extraout_EDX_02, BVar7 == no)) {
LAB_00145ad3:
      PPrintEndTag(doc,mode_00,uVar19,(Node *)node_01);
    }
  }
  if (local_48 == 0 && local_58 == 0) {
    if (node->tag != (Dict *)0x0) {
      if ((iVar1 != 1) && (node->tag->id != TidyTag_HTML)) goto LAB_00145423;
      goto LAB_00145ae5;
    }
    if (iVar1 != 1) goto LAB_00145423;
  }
  else {
LAB_00145ae5:
    if (iVar1 != 1) {
      return;
    }
  }
  if ((node->next == (Node *)0x0) || (BVar7 = prvTidynodeHasCM(node,0xe8), BVar7 == no)) {
    return;
  }
LAB_00145423:
  PFlushLineSmart(doc,indent);
  return;
}

Assistant:

void TY_(PPrintTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Node *content, *last;
    uint spaces = cfg( doc, TidyIndentSpaces );
    Bool xhtml = cfgBool( doc, TidyXhtmlOut );

    if ( node == NULL )
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }

#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_PPRINT)
    dbg_show_node( doc, node, 4, GetSpaces( &doc->pprint ) );
#endif

    if (node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PPrintComment( doc, indent, node );
    }
    else if ( node->type == RootNode )
    {
        for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag)
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl)
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag)
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag)
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag)
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( nodeIsMATHML(node) )
        PPrintMathML( doc, indent, node ); /* #130 MathML attr and entity fix! */
    else if ( TY_(nodeCMIsEmpty)(node) ||
              (node->type == StartEndTag && !xhtml) )
    {
        /* Issue #8 - flush to new line? 
           maybe use if ( TY_(nodeHasCM)(node, CM_BLOCK) ) instead
           or remove the CM_INLINE from the tag
         */
        if ( ! TY_(nodeHasCM)(node, CM_INLINE) )
            PCondFlushLineSmart( doc, indent );

        if ( nodeIsBR(node) && node->prev &&
             !(nodeIsBR(node->prev) || (mode & PREFORMATTED)) &&
             cfgBool(doc, TidyBreakBeforeBR) )
            PFlushLineSmart( doc, indent );

        if ( nodeIsHR(node) )
        {
            /* insert extra newline for classic formatting */
            Bool classic = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }
        }

        PPrintTag( doc, mode, indent, node );

        if (node->next)
        {
          if (nodeIsPARAM(node) || nodeIsAREA(node))
              PCondFlushLineSmart(doc, indent);
          else if ((nodeIsBR(node) && !(mode & PREFORMATTED))
                   || nodeIsHR(node))
              PFlushLineSmart(doc, indent);
        }
    }
    else /* some kind of container element */
    {
        if ( node->type == StartEndTag )
            node->type = StartTag;

        if ( node->tag && 
             (node->tag->parser == TY_(ParsePre) || nodeIsTEXTAREA(node)) )
        {
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint indprev = indent;

            PCondFlushLineSmart( doc, indent ); /* about to add <pre> tag - clear any previous */

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }

            /* Issue #697 - Add NOWRAP to the mode */
            PPrintTag( doc, (mode | NOWRAP), indent, node );   /* add <pre> or <textarea> tag */

            indent = 0;
            /* @camoy Fix #158 - remove inserted newlines in pre - PFlushLineSmart( doc, indent ); */

            for ( content = node->content; content; content = content->next )
            {
                TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP),
                                 indent, content );
            }

            /* @camoy Fix #158 - remove inserted newlines in pre - PCondFlushLineSmart( doc, indent ); */
            indent = indprev;
            PPrintEndTag( doc, mode, indent, node );

            if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
                 && node->next != NULL )
                PFlushLineSmart( doc, indent );
        }
        else if ( nodeIsSTYLE(node) || nodeIsSCRIPT(node) )
        {
            PPrintScriptStyle( doc, (mode | PREFORMATTED | NOWRAP | CDATA),
                               indent, node );
        }
        else if ( TY_(nodeCMIsInline)(node) )
        {
            if ( cfgBool(doc, TidyMakeClean) )
            {
                /* replace <nobr>...</nobr> by &nbsp; or &#160; etc. */
                if ( nodeIsNOBR(node) )
                {
                    for ( content = node->content;
                          content != NULL;
                          content = content->next)
                        TY_(PPrintTree)( doc, mode|NOWRAP, indent, content );
                    return;
                }
            }

            /* otherwise a normal inline element */
            PPrintTag( doc, mode, indent, node );

            /* indent content for SELECT, TEXTAREA, MAP, OBJECT and APPLET */
            if ( ShouldIndent(doc, node) )
            {
                indent += spaces;
                PCondFlushLineSmart( doc, indent );

                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );

                indent -= spaces;
                PCondFlushLineSmart( doc, indent );
                /* PCondFlushLine( doc, indent ); */
            }
            else
            {
                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );
            }
            PPrintEndTag( doc, mode, indent, node );
        }
        else /* other tags */
        {
            Bool indcont  = ( cfgAutoBool(doc, TidyIndentContent) != TidyNoState );
            /* Issue #582 - Seems this is no longer used
               Bool indsmart = ( cfgAutoBool(doc, TidyIndentContent) == TidyAutoState ); */
            Bool hideend  = cfgBool( doc, TidyOmitOptionalTags );
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint contentIndent = indent;

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node && !nodeIsHTML(node))
            {
                PFlushLineSmart( doc, indent );
            }

            if ( ShouldIndent(doc, node) )
                contentIndent += spaces;

            PCondFlushLineSmart( doc, indent );

            /*\
             *  Issue #180 - with the above PCondFlushLine, 
             *  this adds an unnecessary additional line!
             *  Maybe only if 'classic' ie --vertical-space yes 
             *  Issue #582 - maybe this is no longer needed!
             *  It adds a 3rd newline if indent: auto...
             *  if ( indsmart && node->prev != NULL && classic)
             *   PFlushLineSmart( doc, indent );
            \*/

            /* do not omit elements with attributes */
            if ( !hideend || !TY_(nodeHasCM)(node, CM_OMITST) ||
                 node->attributes != NULL )
            {
                PPrintTag( doc, mode, indent, node );

                if ( ShouldIndent(doc, node) )
                {
                    /* fix for bug 530791, don't wrap after */
                    /* <li> if first child is text node     */
                    if (!(nodeIsLI(node) && TY_(nodeIsText)(node->content)))
                        PCondFlushLineSmart( doc, contentIndent );
                }
                else if ( TY_(nodeHasCM)(node, CM_HTML) || nodeIsNOFRAMES(node) ||
                          (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node)) )
                    PFlushLineSmart( doc, contentIndent );
            }
            else if ( ShouldIndent(doc, node) )
            {
                /*\
                 * Issue #180 - If the tag was NOT printed due to the -omit option,
                 * then reduce the bumped indent under the same ShouldIndent(doc, node) 
                 * conditions that caused the indent to be bumped.
                \*/
                contentIndent -= spaces;
            }

            last = NULL;
            for ( content = node->content; content; content = content->next )
            {
                /* kludge for naked text before block level tag */
                if ( last && !indcont && TY_(nodeIsText)(last) &&
                     content->tag && !TY_(nodeHasCM)(content, CM_INLINE) )
                {
                    /* TY_(PFlushLine)(fout, indent); */
                    PFlushLineSmart( doc, contentIndent );
                }

                TY_(PPrintTree)( doc, mode, contentIndent, content );
                last = content;
            }

            /* don't flush line for td and th */
            if ( ShouldIndent(doc, node) ||
                 ( !hideend &&
                   ( TY_(nodeHasCM)(node, CM_HTML) || 
                     nodeIsNOFRAMES(node) ||
                     (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node))
                   )
                 )
               )
            {
                PCondFlushLineSmart( doc, indent );
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    PPrintEndTag( doc, mode, indent, node );
                    /* TY_(PFlushLine)( doc, indent ); */
                }
            }
            else
            {
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    /* newline before endtag for classic formatting */
                    if ( classic && !HasMixedContent(node) )
                        PFlushLineSmart( doc, indent );
                    PPrintEndTag( doc, mode, indent, node );
                }
                else if (hideend)
                {
                    /* Issue #390  - must still deal with adjusting indent */
                    TidyPrintImpl* pprint = &doc->pprint;
                    if (pprint->indent[ 0 ].spaces != (int)indent)
                    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
                        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
                        pprint->indent[ 0 ].spaces = indent;
                    }
                }
            }

            if (!indcont && !hideend && !nodeIsHTML(node) && !classic)
                PFlushLineSmart( doc, indent );
            else if (classic && node->next != NULL && TY_(nodeHasCM)(node, CM_LIST|CM_DEFLIST|CM_TABLE|CM_BLOCK/*|CM_HEADING*/))
                PFlushLineSmart( doc, indent );
        }
    }
}